

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortestPathTN93.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  FILE *__stream;
  FILE *__stream_00;
  unsigned_long uVar3;
  double dVar4;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  long in_RSI;
  int in_EDI;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long which_arg;
  bool is_json;
  unsigned_long add_this_node;
  double step_penalty;
  double normalizer;
  double percentDone;
  unsigned_long source;
  unsigned_long sequenceCount;
  char automatonState;
  char resolutionOption;
  FILE *FO;
  FILE *F;
  long min_overlap;
  long firstSequenceLength;
  char *S;
  undefined1 in_stack_0000020f;
  double in_stack_00000210;
  undefined1 in_stack_0000021f;
  Vector *in_stack_00000220;
  Vector *in_stack_00000228;
  StringBuffer *in_stack_00000230;
  StringBuffer *in_stack_00000238;
  char *in_stack_00000240;
  FILE *in_stack_00000248;
  long *in_stack_00000260;
  Vector *in_stack_00000270;
  char in_stack_00000278;
  long *source_00;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffff24;
  long in_stack_ffffffffffffff28;
  unsigned_long uVar14;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar15;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  Vector *in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  Vector *this;
  double in_stack_ffffffffffffff60;
  FILE *pFVar17;
  FILE *firstSequenceLength_00;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar18;
  _Setw in_stack_ffffffffffffff8c;
  unsigned_long in_stack_ffffffffffffff90;
  double local_58;
  long local_20;
  char *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 9) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage is `");
    poVar2 = std::operator<<(poVar2,Usage);
    poVar2 = std::operator<<(poVar2,"\'.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  local_18 = *(char **)(in_RSI + 8);
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = atoi(*(char **)(in_RSI + 0x20));
  if (iVar1 < 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Minimum overlap must be a positive integer");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    iVar1 = strcmp(local_18,"-");
    __stream = _stdin;
    if (iVar1 != 0) {
      __stream = fopen(local_18,"r");
    }
    firstSequenceLength_00 = __stream;
    iVar1 = strcmp(*(char **)(local_10 + 0x10),"-");
    __stream_00 = _stdout;
    if (iVar1 != 0) {
      __stream_00 = fopen(*(char **)(local_10 + 0x10),"w");
    }
    if (__stream == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open file `");
      poVar2 = std::operator<<(poVar2,local_18);
      poVar2 = std::operator<<(poVar2,"\'.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
    else if (__stream_00 == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open file `");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(void *)0x0);
      poVar2 = std::operator<<(poVar2,"\'.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
    else {
      pFVar17 = __stream_00;
      iVar1 = strcmp(*(char **)(local_10 + 0x18),"GAPMM");
      if ((iVar1 != 0) && (iVar1 = strcmp(*(char **)(local_10 + 0x18),"AVERAGE"), iVar1 != 0)) {
        strcmp(*(char **)(local_10 + 0x18),"SKIP");
      }
      Vector::appendValue((Vector *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
      Vector::appendValue((Vector *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
      initAlphabets(SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),
                    (char *)in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
      source_00 = &local_20;
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0x3a;
      uVar16 = 0;
      iVar1 = readFASTA(in_stack_00000248,in_stack_00000240,in_stack_00000238,in_stack_00000230,
                        in_stack_00000228,in_stack_00000220,in_stack_00000260,
                        (bool)in_stack_0000021f,in_stack_00000270,in_stack_00000278,
                        in_stack_00000210,(bool)in_stack_0000020f);
      if (iVar1 == 1) {
        local_4 = 1;
      }
      else {
        fclose(__stream);
        uVar3 = Vector::length(&seqLengths);
        dVar4 = (double)(uVar3 - 1);
        poVar2 = std::operator<<((ostream *)&std::cerr,"Read ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)dVar4);
        poVar2 = std::operator<<(poVar2," sequences of length ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        iVar1 = atoi(*(char **)(local_10 + 0x28));
        if ((ulong)(long)iVar1 < (ulong)dVar4) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Using ");
          pcVar5 = stringText((StringBuffer *)CONCAT44(in_stack_ffffffffffffff3c,uVar16),
                              (Vector *)CONCAT44(in_stack_ffffffffffffff34,uVar15),uVar14);
          poVar6 = std::operator<<(poVar2,pcVar5);
          poVar6 = std::operator<<(poVar6," as the source");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          initializeSingleSource
                    (CONCAT44(in_stack_ffffffffffffff24,uVar13),(unsigned_long)source_00);
          local_58 = 0.0;
          auVar12._8_4_ = (int)((ulong)dVar4 >> 0x20);
          auVar12._0_8_ = dVar4;
          auVar12._12_4_ = 0x45300000;
          dVar8 = 100.0 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,SUB84(dVar4,0)) - 4503599627370496.0));
          dVar9 = atof(*(char **)(local_10 + 0x38));
          if (0.0 < dVar9) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Using step penalty of ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            while (uVar14 = Vector::length(&workingNodes), uVar14 != 0) {
              this = &workingNodes;
              in_stack_ffffffffffffff90 =
                   Vector::extractMin(in_stack_ffffffffffffff48,
                                      (VectorDouble *)
                                      CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
              ;
              relaxDistanceEstimates
                        ((unsigned_long)in_stack_ffffffffffffff60,(long)this,
                         (char)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                         (long)in_stack_ffffffffffffff48,
                         (double)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
              in_stack_ffffffffffffff60 = dVar4;
              uVar14 = Vector::length(this);
              lVar7 = (long)in_stack_ffffffffffffff60 - uVar14;
              auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
              auVar10._0_8_ = lVar7;
              auVar10._12_4_ = 0x45300000;
              if ((0.1 < ((auVar10._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * dVar8 +
                         -local_58) || (uVar14 = Vector::length(&workingNodes), uVar14 == 0)) {
                in_stack_ffffffffffffff48 =
                     (Vector *)
                     std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                                    );
                in_stack_ffffffffffffff8c = std::setw(8);
                poVar6 = std::operator<<((ostream *)in_stack_ffffffffffffff48,
                                         in_stack_ffffffffffffff8c);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_58);
                std::operator<<(poVar6,"% done ");
                in_stack_ffffffffffffff50 = dVar4;
                uVar14 = Vector::length(&workingNodes);
                lVar7 = (long)in_stack_ffffffffffffff50 - uVar14;
                auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
                auVar11._0_8_ = lVar7;
                auVar11._12_4_ = 0x45300000;
                local_58 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * dVar8;
              }
            }
            std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
            iVar1 = strcmp(*(char **)(local_10 + 0x30),"JSON");
            uVar18 = CONCAT13(iVar1 == 0,(int3)in_stack_ffffffffffffff88);
            if (iVar1 == 0) {
              fprintf(__stream_00,"\n{\n");
            }
            for (lVar7 = 8; lVar7 < local_8; lVar7 = lVar7 + 1) {
              atoi(*(char **)(local_10 + lVar7 * 8));
              reportPathToSource(in_stack_ffffffffffffff90,
                                 (FILE *)CONCAT44(in_stack_ffffffffffffff8c._M_n,uVar18),
                                 SUB81((ulong)lVar7 >> 0x38,0),(long)firstSequenceLength_00,
                                 (char)((ulong)pFVar17 >> 0x38),(long)poVar2,
                                 in_stack_ffffffffffffff60);
              if (((uVar18 & 0x1000000) != 0) && (lVar7 < local_8 + -1)) {
                fprintf(__stream_00,",\n");
              }
            }
            if ((uVar18 & 0x1000000) != 0) {
              fprintf(__stream_00,"\n}\n");
            }
            if (__stream_00 != _stdout) {
              fclose(__stream_00);
            }
            local_4 = 0;
          }
          else {
            std::operator<<((ostream *)&std::cerr,"Invalid step penalty");
            local_4 = 1;
          }
        }
        else {
          std::operator<<((ostream *)&std::cerr,"Invalid source sequence index");
          local_4 = 1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main (int argc, const char * argv[])
{
    if (argc < 9)
    {
        cerr << "Usage is `" << Usage << "'." << endl;
        exit(1);
    }

    const    char *S = argv[1];

    long     firstSequenceLength = 0,
             min_overlap = 1;


    /*if (distanceThreshold > 0.)
    	min_overlap = 1./distanceThreshold;*/

    min_overlap = atoi (argv[4]);
    if (min_overlap < 1) {
        cerr << "Minimum overlap must be a positive integer" << endl;
        return 1;
    }


    FILE *F  = strcmp (S,"-") == 0 ? stdin: fopen(S, "r"),
          *FO = strcmp (argv[2],"-") == 0? stdout: fopen (argv[2], "w");

    if (F == NULL) {
        cerr << "Cannot open file `" << S << "'." << endl;
        return 1;
    }

    if (FO == NULL) {
        cerr << "Cannot open file `" << FO << "'." << endl;
        return 1;
    }

    char resolutionOption = RESOLVE;

    if (strcmp (argv[3], "GAPMM") == 0) {
        resolutionOption = GAPMM;
    } else if (strcmp (argv[3], "AVERAGE") == 0) {
        resolutionOption = AVERAGE;
    } else if (strcmp (argv[3], "SKIP") == 0) {
        resolutionOption = SKIP;
    }




    char automatonState = 0;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence

    nameLengths.appendValue (0);
    seqLengths.appendValue (0);
    initAlphabets ();

    if (readFASTA (F, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength) == 1)
        return 1;

    fclose(F);

    unsigned long sequenceCount = seqLengths.length()-1;

    cerr << "Read " << sequenceCount << " sequences of length " << firstSequenceLength << endl ;

    unsigned long source = atoi (argv[5]);
    if (source < 0 || source >= sequenceCount) {
        cerr << "Invalid source sequence index";
        return 1;
    } else {
        cerr << "Using " << stringText (names, nameLengths, source) << " as the source" << endl;
    }

    initializeSingleSource (sequenceCount, source);

    double percentDone = 0.0,
           normalizer  = 100./sequenceCount,
           step_penalty = 10.;

    step_penalty = atof (argv[7]);
    if (step_penalty <= 0.0) {
        cerr << "Invalid step penalty";
        return 1;
    } else {
        cerr << "Using step penalty of " << step_penalty << endl;
    }

    while (workingNodes.length()) {
        unsigned long add_this_node = workingNodes.extractMin (distanceEstimates);
        relaxDistanceEstimates (add_this_node,firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if ((sequenceCount-workingNodes.length()) * normalizer - percentDone > 0.1 || workingNodes.length () == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << percentDone << "% done ";
            percentDone = (sequenceCount-workingNodes.length()) * normalizer;
        }
    }
    cerr << endl;

    bool is_json = strcmp (argv[6],"JSON") == 0;

    if (is_json) {
        fprintf (FO, "\n{\n");
    }

    for (long which_arg = 8; which_arg < argc; which_arg ++) {
        reportPathToSource (atoi (argv[which_arg]),FO, is_json, firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if (is_json && which_arg < argc - 1) {
            fprintf (FO, ",\n");
        }
    }

    if (is_json) {
        fprintf (FO, "\n}\n");
    }

    if (FO != stdout)
        fclose (FO);
    return 0;

}